

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O2

int __thiscall cursespp::ShortcutsWindow::getActiveIndex(ShortcutsWindow *this)

{
  pointer psVar1;
  __type _Var2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    psVar1 = (this->entries).
             super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->entries).
                            super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4) <=
        lVar4) {
      return -1;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)((long)&(psVar1->
                                              super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar3) + 8),&this->activeKey);
    if (_Var2) break;
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x10;
  }
  return (int)lVar4;
}

Assistant:

int ShortcutsWindow::getActiveIndex() {
    for (int i = 0; i < (int) this->entries.size(); i++) {
        if (this->entries[i]->key == this->activeKey) {
            return i;
        }
    }
    return -1;
}